

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::makefacetverticesmap(tetgenmesh *this)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  memorypool *pmVar5;
  void **ppvVar6;
  long lVar7;
  char **ppcVar8;
  arraypool *this_00;
  void *pvVar9;
  arraypool *paVar10;
  char *pcVar11;
  arraypool *paVar12;
  long lVar13;
  char *pcVar14;
  int *piVar15;
  point *ppdVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  long local_70;
  
  if (this->b->verbose != 0) {
    puts("  Creating the facet vertices map.");
  }
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 8;
  this_00->objectsperblock = 0x400;
  this_00->log2objectsperblock = 10;
  this_00->objectsperblockmark = 0x3ff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  pmVar5 = this->subfaces;
  ppvVar6 = pmVar5->firstblock;
  pmVar5->pathblock = ppvVar6;
  uVar20 = 0;
  pmVar5->pathitem =
       (void *)((long)ppvVar6 +
               (((long)pmVar5->alignbytes + 8U) -
               (ulong)(ppvVar6 + 1) % (ulong)(long)pmVar5->alignbytes));
  pmVar5->pathitemsleft = pmVar5->itemsperblock;
  while (pvVar9 = memorypool::traverse(pmVar5), pvVar9 != (void *)0x0) {
    if (*(long *)((long)pvVar9 + 0x18) != 0) {
      local_70 = 0;
      iVar26 = 0;
      uVar20 = 0;
      do {
        if ((*(byte *)((long)pvVar9 + (long)this->shmarkindex * 4 + 4) & 1) == 0) {
          paVar10 = (arraypool *)operator_new(0x30);
          paVar10->objectbytes = 8;
          paVar10->objectsperblock = 0x100;
          paVar10->log2objectsperblock = 8;
          paVar10->objectsperblockmark = 0xff;
          paVar10->toparraylen = 0;
          paVar10->toparray = (char **)0x0;
          paVar10->objects = 0;
          paVar10->totalmemory = 0;
          lVar18 = 3;
          lVar22 = 0;
          do {
            lVar13 = *(long *)((long)pvVar9 + lVar18 * 8);
            uVar17 = *(uint *)(lVar13 + 4 + (long)this->pointmarkindex * 4);
            if (((int)uVar17 >> 8) - 8U < 0xfffffffe) {
              *(uint *)(lVar13 + 4 + (long)this->pointmarkindex * 4) = uVar17 | 1;
              pcVar11 = arraypool::getblock(paVar10,(int)lVar22);
              uVar23 = paVar10->objects;
              lVar22 = uVar23 + 1;
              paVar10->objects = lVar22;
              *(undefined8 *)
               (pcVar11 +
               (long)paVar10->objectbytes * ((long)paVar10->objectsperblock - 1U & uVar23)) =
                   *(undefined8 *)((long)pvVar9 + lVar18 * 8);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 != 6);
          puVar1 = (uint *)((long)pvVar9 + (long)this->shmarkindex * 4 + 4);
          *puVar1 = *puVar1 | 1;
          paVar12 = this->caveshlist;
          pcVar11 = arraypool::getblock(paVar12,(int)paVar12->objects);
          lVar18 = (long)paVar12->objectbytes *
                   ((long)paVar12->objectsperblock - 1U & paVar12->objects);
          paVar12->objects = paVar12->objects + 1;
          *(void **)(pcVar11 + lVar18) = pvVar9;
          pcVar11 = pcVar11 + lVar18 + 8;
          pcVar11[0] = '\0';
          pcVar11[1] = '\0';
          pcVar11[2] = '\0';
          pcVar11[3] = '\0';
          paVar12 = this->caveshlist;
          if (0 < paVar12->objects) {
            lVar18 = 0;
            do {
              pcVar11 = paVar12->toparray
                        [(uint)lVar18 >> ((byte)paVar12->log2objectsperblock & 0x1f)];
              lVar22 = (long)paVar12->objectbytes *
                       (long)(int)(paVar12->objectsperblockmark & (uint)lVar18);
              *(int *)(*(long *)(pcVar11 + lVar22) + 8 + (long)this->shmarkindex * 4) = (int)uVar20;
              iVar19 = *(int *)(pcVar11 + lVar22 + 8);
              iVar24 = 3;
              do {
                if (*(long *)(*(long *)(pcVar11 + lVar22) + 0x30 + (long)(iVar19 >> 1) * 8) == 0) {
                  uVar23 = *(ulong *)(*(long *)(pcVar11 + lVar22) + (long)(iVar19 >> 1) * 8);
                  uVar21 = uVar23 & 0xfffffffffffffff8;
                  lVar13 = (long)this->shmarkindex;
                  uVar17 = *(uint *)(uVar21 + 4 + lVar13 * 4);
                  if ((uVar17 & 1) == 0) {
                    uVar25 = (uint)uVar23;
                    lVar7 = *(long *)(uVar21 + (long)sapexpivot[uVar25 & 7] * 8);
                    uVar2 = *(uint *)(lVar7 + 4 + (long)this->pointmarkindex * 4);
                    if (((uVar2 & 1) == 0) && (((int)uVar2 >> 8) - 8U < 0xfffffffe)) {
                      *(uint *)(lVar7 + 4 + (long)this->pointmarkindex * 4) = uVar2 | 1;
                      pcVar14 = arraypool::getblock(paVar10,(int)paVar10->objects);
                      uVar23 = paVar10->objects;
                      paVar10->objects = uVar23 + 1;
                      *(long *)(pcVar14 +
                               (long)paVar10->objectbytes *
                               ((long)paVar10->objectsperblock - 1U & uVar23)) = lVar7;
                      lVar13 = (long)this->shmarkindex;
                      uVar17 = *(uint *)(uVar21 + 4 + lVar13 * 4);
                    }
                    *(uint *)(uVar21 + 4 + lVar13 * 4) = uVar17 | 1;
                    paVar12 = this->caveshlist;
                    pcVar14 = arraypool::getblock(paVar12,(int)paVar12->objects);
                    lVar13 = (long)paVar12->objectbytes *
                             ((long)paVar12->objectsperblock - 1U & paVar12->objects);
                    paVar12->objects = paVar12->objects + 1;
                    *(ulong *)(pcVar14 + lVar13) = uVar21;
                    *(uint *)(pcVar14 + lVar13 + 8) = uVar25 & 7;
                    iVar19 = *(int *)(pcVar11 + lVar22 + 8);
                  }
                }
                iVar19 = snextpivot[iVar19];
                *(int *)(pcVar11 + lVar22 + 8) = iVar19;
                iVar24 = iVar24 + -1;
              } while (iVar24 != 0);
              lVar18 = lVar18 + 1;
              paVar12 = this->caveshlist;
            } while (lVar18 < paVar12->objects);
          }
          lVar18 = paVar10->objects;
          if (0 < lVar18) {
            ppcVar8 = paVar10->toparray;
            lVar22 = 0;
            do {
              puVar1 = (uint *)(*(long *)(ppcVar8[(uint)lVar22 >>
                                                  ((byte)paVar10->log2objectsperblock & 0x1f)] +
                                         (long)paVar10->objectbytes *
                                         (long)(int)(paVar10->objectsperblockmark & (uint)lVar22)) +
                                4 + (long)this->pointmarkindex * 4);
              *puVar1 = *puVar1 & 0xfffffffe;
              lVar22 = lVar22 + 1;
            } while (lVar18 != lVar22);
          }
          iVar26 = iVar26 + (int)lVar18;
          paVar12->objects = 0;
          pcVar11 = arraypool::getblock(this_00,(int)local_70);
          uVar23 = this_00->objects;
          local_70 = uVar23 + 1;
          this_00->objects = local_70;
          *(arraypool **)
           (pcVar11 + (long)this_00->objectbytes * ((long)this_00->objectsperblock - 1U & uVar23)) =
               paVar10;
          uVar20 = (ulong)((int)uVar20 + 1);
        }
        pmVar5 = this->subfaces;
        do {
          pvVar9 = memorypool::traverse(pmVar5);
          if (pvVar9 == (void *)0x0) goto LAB_0013a766;
        } while (*(long *)((long)pvVar9 + 0x18) == 0);
      } while( true );
    }
  }
  local_70 = 0;
  iVar26 = 0;
LAB_0013a766:
  pmVar5 = this->subfaces;
  ppvVar6 = pmVar5->firstblock;
  pmVar5->pathblock = ppvVar6;
  pmVar5->pathitem =
       (void *)((long)ppvVar6 +
               (((long)pmVar5->alignbytes + 8U) -
               (ulong)(ppvVar6 + 1) % (ulong)(long)pmVar5->alignbytes));
  pmVar5->pathitemsleft = pmVar5->itemsperblock;
  do {
    pvVar9 = memorypool::traverse(pmVar5);
    if (pvVar9 == (void *)0x0) {
LAB_0013a7dd:
      if (this->b->verbose != 0) {
        printf("  Found %ld facets.\n",local_70);
      }
      iVar19 = (int)uVar20;
      uVar23 = (long)iVar19 * 4 + 4;
      if (iVar19 < -1) {
        uVar23 = 0xffffffffffffffff;
      }
      piVar15 = (int *)operator_new__(uVar23);
      this->idx2facetlist = piVar15;
      uVar23 = 0xffffffffffffffff;
      if (-1 < iVar26) {
        uVar23 = (long)iVar26 * 8;
      }
      ppdVar16 = (point *)operator_new__(uVar23);
      this->facetverticeslist = ppdVar16;
      this->totalworkmemory = this->totalworkmemory + (long)iVar26 * 8 + (long)iVar19 * 4 + 4;
      *piVar15 = 0;
      if (0 < iVar19) {
        ppcVar8 = this_00->toparray;
        iVar26 = this_00->log2objectsperblock;
        uVar17 = this_00->objectsperblockmark;
        iVar19 = this_00->objectbytes;
        uVar23 = 0;
        iVar24 = 0;
        do {
          piVar15 = *(int **)(ppcVar8[(uint)uVar23 >> ((byte)iVar26 & 0x1f)] +
                             (long)(int)((uint)uVar23 & uVar17) * (long)iVar19);
          lVar18 = *(long *)(piVar15 + 8);
          this->idx2facetlist[uVar23 + 1] = this->idx2facetlist[uVar23] + (int)lVar18;
          if (0 < lVar18) {
            iVar3 = piVar15[2];
            uVar2 = piVar15[3];
            iVar4 = *piVar15;
            lVar22 = 0;
            do {
              this->facetverticeslist[iVar24 + lVar22] =
                   *(point *)(*(long *)(*(long *)(piVar15 + 6) +
                                       (ulong)((uint)lVar22 >> ((byte)iVar3 & 0x1f)) * 8) +
                             (long)(int)((uint)lVar22 & uVar2) * (long)iVar4);
              lVar22 = lVar22 + 1;
            } while (lVar18 != lVar22);
            iVar24 = iVar24 + (int)lVar22;
          }
          uVar23 = uVar23 + 1;
        } while (uVar23 != uVar20);
      }
      if (0 < local_70) {
        ppcVar8 = this_00->toparray;
        iVar26 = this_00->log2objectsperblock;
        uVar17 = this_00->objectsperblockmark;
        iVar19 = this_00->objectbytes;
        lVar18 = 0;
        do {
          paVar10 = *(arraypool **)
                     (ppcVar8[(uint)lVar18 >> ((byte)iVar26 & 0x1f)] +
                     (long)(int)((uint)lVar18 & uVar17) * (long)iVar19);
          if (paVar10 != (arraypool *)0x0) {
            arraypool::~arraypool(paVar10);
          }
          operator_delete(paVar10,0x30);
          lVar18 = lVar18 + 1;
        } while (lVar18 < local_70);
      }
      arraypool::~arraypool(this_00);
      operator_delete(this_00,0x30);
      return;
    }
  } while (*(long *)((long)pvVar9 + 0x18) == 0);
  do {
    puVar1 = (uint *)((long)pvVar9 + (long)this->shmarkindex * 4 + 4);
    *puVar1 = *puVar1 & 0xfffffffe;
    pmVar5 = this->subfaces;
    do {
      pvVar9 = memorypool::traverse(pmVar5);
      if (pvVar9 == (void *)0x0) goto LAB_0013a7dd;
    } while (*(long *)((long)pvVar9 + 0x18) == 0);
  } while( true );
}

Assistant:

void tetgenmesh::makefacetverticesmap()
{
  arraypool *facetvertexlist, *vertlist, **paryvertlist;
  face subloop, neighsh, *parysh, *parysh1;
  point pa, *ppt, *parypt;
  verttype vt;
  int facetindex, totalvertices;
  int i, j, k;

  if (b->verbose) {
    printf("  Creating the facet vertices map.\n");
  }

  facetvertexlist = new arraypool(sizeof(arraypool *), 10);
  facetindex = totalvertices = 0;

  subfaces->traversalinit();
  subloop.sh = shellfacetraverse(subfaces);
  while (subloop.sh != NULL) {
    if (!sinfected(subloop)) {
      // A new facet. Create its vertices list.
      vertlist = new arraypool(sizeof(point *), 8);
      ppt = (point *) &(subloop.sh[3]);
      for (k = 0; k < 3; k++) {
        vt = pointtype(ppt[k]);
        if ((vt != FREESEGVERTEX) && (vt != FREEFACETVERTEX)) {
          pinfect(ppt[k]);
          vertlist->newindex((void **) &parypt);
          *parypt = ppt[k];
        }
      }
      sinfect(subloop);
      caveshlist->newindex((void **) &parysh);
      *parysh = subloop;
      for (i = 0; i < caveshlist->objects; i++) {
        parysh = (face *) fastlookup(caveshlist, i);
        setfacetindex(*parysh, facetindex);
        for (j = 0; j < 3; j++) {
          if (!isshsubseg(*parysh)) {
            spivot(*parysh, neighsh);
            if (!sinfected(neighsh)) {
              pa = sapex(neighsh);
              if (!pinfected(pa)) {
                vt = pointtype(pa);
                if ((vt != FREESEGVERTEX) && (vt != FREEFACETVERTEX)) {
                  pinfect(pa);
                  vertlist->newindex((void **) &parypt);
                  *parypt = pa;
                }
              }
              sinfect(neighsh);
              caveshlist->newindex((void **) &parysh1);
              *parysh1 = neighsh;
            }
          }
          senextself(*parysh);
        }
      } // i
      totalvertices += (int) vertlist->objects;
      // Uninfect facet vertices.
      for (k = 0; k < vertlist->objects; k++) {
        parypt = (point *) fastlookup(vertlist, k);
        puninfect(*parypt);
      }
      caveshlist->restart();
      // Save this vertex list.
      facetvertexlist->newindex((void **) &paryvertlist);
      *paryvertlist = vertlist;
      facetindex++;
    } 
    subloop.sh = shellfacetraverse(subfaces);
  }

  // All subfaces are infected. Uninfect them.
  subfaces->traversalinit();
  subloop.sh = shellfacetraverse(subfaces);
  while (subloop.sh != NULL) {
    suninfect(subloop);
    subloop.sh = shellfacetraverse(subfaces);
  }

  if (b->verbose) {
    printf("  Found %ld facets.\n", facetvertexlist->objects);
  }

  idx2facetlist = new int[facetindex + 1];
  facetverticeslist = new point[totalvertices];

  totalworkmemory += ((facetindex + 1) * sizeof(int) + 
                      totalvertices * sizeof(point *));

  idx2facetlist[0] = 0;
  for (i = 0, k = 0; i < facetindex; i++) {
    paryvertlist = (arraypool **) fastlookup(facetvertexlist, i);
    vertlist = *paryvertlist;
    idx2facetlist[i + 1] = (idx2facetlist[i] + (int) vertlist->objects);
    for (j = 0; j < vertlist->objects; j++) {
      parypt = (point *) fastlookup(vertlist, j);
      facetverticeslist[k] = *parypt;
      k++;
    }
  }

  // Free the lists.
  for (i = 0; i < facetvertexlist->objects; i++) {
    paryvertlist = (arraypool **) fastlookup(facetvertexlist, i);
    vertlist = *paryvertlist;
    delete vertlist;
  }
  delete facetvertexlist;
}